

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# php_generator.cc
# Opt level: O0

void google::protobuf::compiler::php::GenerateMessageDocComment
               (Printer *printer,Descriptor *message)

{
  Descriptor *this;
  string *input;
  string local_38;
  Descriptor *local_18;
  Descriptor *message_local;
  Printer *printer_local;
  
  local_18 = message;
  message_local = (Descriptor *)printer;
  io::Printer::Print(printer,"/**\n");
  GenerateDocCommentBody<google::protobuf::Descriptor>((Printer *)message_local,local_18);
  this = message_local;
  input = Descriptor::full_name_abi_cxx11_(local_18);
  EscapePhpdoc(&local_38,input);
  io::Printer::Print((Printer *)this," * Protobuf type <code>^fullname^</code>\n */\n","fullname",
                     &local_38);
  std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

void GenerateMessageDocComment(io::Printer* printer,
                               const Descriptor* message) {
  printer->Print("/**\n");
  GenerateDocCommentBody(printer, message);
  printer->Print(
    " * Protobuf type <code>^fullname^</code>\n"
    " */\n",
    "fullname", EscapePhpdoc(message->full_name()));
}